

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O1

string * __thiscall
NoViableAltException::getErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,NoViableAltException *this)

{
  size_type *psVar1;
  Ref *pRVar2;
  Ref *pRVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  string local_58;
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  pRVar2 = (this->token).ref;
  if ((pRVar2 == (Ref *)0x0) || (pRVar2->ptr == (Token *)0x0)) {
    pRVar3 = (this->node).ref;
    if ((pRVar3 == (Ref *)0x0) || (pRVar3->ptr == (AST *)0x0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"unexpected end of subtree","");
      return __return_storage_ptr__;
    }
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unexpected AST node: ","");
    AST::toString_abi_cxx11_(&local_58,((this->node).ref)->ptr);
    uVar5 = 0xf;
    if (local_38 != local_28) {
      uVar5 = local_28[0];
    }
    if (uVar5 < local_58._M_string_length + local_30) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        uVar6 = local_58.field_2._M_allocated_capacity;
      }
      if (local_58._M_string_length + local_30 <= (ulong)uVar6) {
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
        goto LAB_001e895b;
      }
    }
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
  }
  else {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"unexpected token: ","");
    (*((this->token).ref)->ptr->_vptr_Token[2])(&local_58);
    uVar5 = 0xf;
    if (local_38 != local_28) {
      uVar5 = local_28[0];
    }
    if (uVar5 < local_58._M_string_length + local_30) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        uVar6 = local_58.field_2._M_allocated_capacity;
      }
      if (local_58._M_string_length + local_30 <= (ulong)uVar6) {
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
        goto LAB_001e895b;
      }
    }
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58._M_dataplus._M_p);
  }
LAB_001e895b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar6 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NoViableAltException::getErrorMessage() const
{
	if (token)
		return std::string("unexpected token: ")+token->getText();

	// must a tree parser error if token==null
	if (!node) {
		return "unexpected end of subtree";
	}
	return std::string("unexpected AST node: ")+node->toString();
}